

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11CachePolicy.cpp
# Opt level: O0

void __thiscall GmmLib::GmmGen11CachePolicy::SetUpMOCSTable(GmmGen11CachePolicy *this)

{
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar1;
  SKU_FEATURE_TABLE *pSVar2;
  int local_1c;
  int index;
  GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement;
  GmmGen11CachePolicy *this_local;
  
  pGVar1 = Context::GetCachePolicyTlbElement
                     ((this->super_GmmGen10CachePolicy).super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xfffe;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xfff1;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xfffffffc | 3;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xfffffff3 | 4;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xffffffcf | 0x30;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xffffffbf;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xffffff7f;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xffffbfff;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xfff9ffff;
  }
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfffe;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfff1;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffffc;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffcf;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffbf;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffff7f;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffbfff;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfffe;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfff1;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffbf;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffff7f;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffbfff;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfffe;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfff1;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffffc | 1;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffcf;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffbf;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffff7f;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffbfff;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfffe;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfff1;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffffc | 1;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffffcf;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffffbf;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffff7f;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffbfff;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xfffe;
  pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xfff1;
  pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffffbf;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffff7f;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffbfff;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xfffe;
  pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xfff1;
  pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffffcf | 0x10;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffffbf;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffff7f;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffbfff;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xfffe;
  pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xfff1;
  pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffffcf | 0x10;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffffbf;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffff7f;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffbfff;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xfffe;
  pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xfff1;
  pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffffcf | 0x20;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffffbf;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffff7f;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffbfff;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[9].L3.UshortValue = pGVar1[9].L3.UshortValue & 0xfffe;
  pGVar1[9].L3.UshortValue = pGVar1[9].L3.UshortValue & 0xfff1;
  pGVar1[9].L3.UshortValue = pGVar1[9].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xffffffcf | 0x20;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xffffffbf;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xffffff7f;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xffffbfff;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[10].L3.UshortValue = pGVar1[10].L3.UshortValue & 0xfffe;
  pGVar1[10].L3.UshortValue = pGVar1[10].L3.UshortValue & 0xfff1;
  pGVar1[10].L3.UshortValue = pGVar1[10].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xffffffbf | 0x40;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xffffff7f;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xffffbfff;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[10].LeCC.DwordValue = pGVar1[10].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0xb].L3.UshortValue = pGVar1[0xb].L3.UshortValue & 0xfffe;
  pGVar1[0xb].L3.UshortValue = pGVar1[0xb].L3.UshortValue & 0xfff1;
  pGVar1[0xb].L3.UshortValue = pGVar1[0xb].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xffffffbf | 0x40;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0xb].LeCC.DwordValue = pGVar1[0xb].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0xc].L3.UshortValue = pGVar1[0xc].L3.UshortValue & 0xfffe;
  pGVar1[0xc].L3.UshortValue = pGVar1[0xc].L3.UshortValue & 0xfff1;
  pGVar1[0xc].L3.UshortValue = pGVar1[0xc].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xffffffcf | 0x10;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xffffffbf | 0x40;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0xc].LeCC.DwordValue = pGVar1[0xc].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0xd].L3.UshortValue = pGVar1[0xd].L3.UshortValue & 0xfffe;
  pGVar1[0xd].L3.UshortValue = pGVar1[0xd].L3.UshortValue & 0xfff1;
  pGVar1[0xd].L3.UshortValue = pGVar1[0xd].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xffffffcf | 0x10;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xffffffbf | 0x40;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0xd].LeCC.DwordValue = pGVar1[0xd].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0xe].L3.UshortValue = pGVar1[0xe].L3.UshortValue & 0xfffe;
  pGVar1[0xe].L3.UshortValue = pGVar1[0xe].L3.UshortValue & 0xfff1;
  pGVar1[0xe].L3.UshortValue = pGVar1[0xe].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xffffffcf | 0x20;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xffffffbf | 0x40;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0xf].L3.UshortValue = pGVar1[0xf].L3.UshortValue & 0xfffe;
  pGVar1[0xf].L3.UshortValue = pGVar1[0xf].L3.UshortValue & 0xfff1;
  pGVar1[0xf].L3.UshortValue = pGVar1[0xf].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xffffffcf | 0x20;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xffffffbf | 0x40;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x10].L3.UshortValue = pGVar1[0x10].L3.UshortValue & 0xfffe;
  pGVar1[0x10].L3.UshortValue = pGVar1[0x10].L3.UshortValue & 0xfff1;
  pGVar1[0x10].L3.UshortValue = pGVar1[0x10].L3.UshortValue & 0xffcf;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffffffc;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffffff3;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffffcf;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x11].L3.UshortValue = pGVar1[0x11].L3.UshortValue & 0xfffe;
  pGVar1[0x11].L3.UshortValue = pGVar1[0x11].L3.UshortValue & 0xfff1;
  pGVar1[0x11].L3.UshortValue = pGVar1[0x11].L3.UshortValue & 0xffcf;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffffffc;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffffff3;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffffcf;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x12].L3.UshortValue = pGVar1[0x12].L3.UshortValue & 0xfffe;
  pGVar1[0x12].L3.UshortValue = pGVar1[0x12].L3.UshortValue & 0xfff1;
  pGVar1[0x12].L3.UshortValue = pGVar1[0x12].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x12].LeCC.DwordValue = pGVar1[0x12].LeCC.DwordValue & 0xfff9ffff | 0x60000;
  pGVar1[0x13].L3.UshortValue = pGVar1[0x13].L3.UshortValue & 0xfffe;
  pGVar1[0x13].L3.UshortValue = pGVar1[0x13].L3.UshortValue & 0xfff1;
  pGVar1[0x13].L3.UshortValue = pGVar1[0x13].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xfffff8ff | 0x700;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x13].LeCC.DwordValue = pGVar1[0x13].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x14].L3.UshortValue = pGVar1[0x14].L3.UshortValue & 0xfffe;
  pGVar1[0x14].L3.UshortValue = pGVar1[0x14].L3.UshortValue & 0xfff1;
  pGVar1[0x14].L3.UshortValue = pGVar1[0x14].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xfffff8ff | 0x300;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x14].LeCC.DwordValue = pGVar1[0x14].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x15].L3.UshortValue = pGVar1[0x15].L3.UshortValue & 0xfffe;
  pGVar1[0x15].L3.UshortValue = pGVar1[0x15].L3.UshortValue & 0xfff1;
  pGVar1[0x15].L3.UshortValue = pGVar1[0x15].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xfffff8ff | 0x100;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x15].LeCC.DwordValue = pGVar1[0x15].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x16].L3.UshortValue = pGVar1[0x16].L3.UshortValue & 0xfffe;
  pGVar1[0x16].L3.UshortValue = pGVar1[0x16].L3.UshortValue & 0xfff1;
  pGVar1[0x16].L3.UshortValue = pGVar1[0x16].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xffffff7f | 0x80;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xfffff8ff | 0x300;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x16].LeCC.DwordValue = pGVar1[0x16].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x17].L3.UshortValue = pGVar1[0x17].L3.UshortValue & 0xfffe;
  pGVar1[0x17].L3.UshortValue = pGVar1[0x17].L3.UshortValue & 0xfff1;
  pGVar1[0x17].L3.UshortValue = pGVar1[0x17].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xffffff7f | 0x80;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xfffff8ff | 0x700;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x17].LeCC.DwordValue = pGVar1[0x17].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xfffe;
  pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xfff1;
  pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfff9ffff;
  pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xfffe;
  pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xfff1;
  pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffffffc | 3;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffffcf | 0x30;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffffbf;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffff7f;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffff8ff;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffc7ff;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffbfff;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffe7fff;
  pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfff9ffff;
  pSVar2 = Context::GetSkuTable
                     ((this->super_GmmGen10CachePolicy).super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
  if (((ulong)pSVar2->field_1 >> 10 & 1) != 0) {
    pGVar1[0x10].L3.UshortValue = pGVar1[0x10].L3.UshortValue & 0xfffe;
    pGVar1[0x10].L3.UshortValue = pGVar1[0x10].L3.UshortValue & 0xfff1;
    pGVar1[0x10].L3.UshortValue = pGVar1[0x10].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffffff3 | 4;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xffffbfff | 0x4000;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x10].LeCC.DwordValue = pGVar1[0x10].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[0x11].L3.UshortValue = pGVar1[0x11].L3.UshortValue & 0xfffe;
    pGVar1[0x11].L3.UshortValue = pGVar1[0x11].L3.UshortValue & 0xfff1;
    pGVar1[0x11].L3.UshortValue = pGVar1[0x11].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffffff3 | 4;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xffffbfff | 0x4000;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x11].LeCC.DwordValue = pGVar1[0x11].LeCC.DwordValue & 0xfff9ffff;
  }
  (this->super_GmmGen10CachePolicy).super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 0x17;
  return;
}

Assistant:

void GmmLib::GmmGen11CachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);

#define GMM_DEFINE_MOCS(Index, L3_ESC, L3_SCC, L3_CC, LeCC_CC, LeCC_TC, LeCC_LRUM, LeCC_AOM, LeCC_ESC, LeCC_SCC, LeCC_PFM, LeCC_SCF, LeCC_CoS, LeCC_SelfSnoop) \
    {                                                                                                                                                          \
        pCachePolicyTlbElement[Index].L3.ESC            = L3_ESC;                                                                                              \
        pCachePolicyTlbElement[Index].L3.SCC            = L3_SCC;                                                                                              \
        pCachePolicyTlbElement[Index].L3.Cacheability   = L3_CC;                                                                                               \
        pCachePolicyTlbElement[Index].LeCC.Cacheability = LeCC_CC;                                                                                             \
        pCachePolicyTlbElement[Index].LeCC.TargetCache  = LeCC_TC;                                                                                             \
        pCachePolicyTlbElement[Index].LeCC.LRUM         = LeCC_LRUM;                                                                                           \
        pCachePolicyTlbElement[Index].LeCC.AOM          = LeCC_AOM;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.ESC          = LeCC_ESC;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.SCC          = LeCC_SCC;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.PFM          = LeCC_PFM;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.SCF          = LeCC_SCF;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.CoS          = LeCC_CoS;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.SelfSnoop    = LeCC_SelfSnoop;                                                                                      \
    }

    // clang-format off

    //Default MOCS Table
    for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
    {  //              Index     ESC    SCC      L3CC    LeCC    TC      LRUM    DAoM    ERSC    SCC     PFM     SCF     CoS     SSE
        GMM_DEFINE_MOCS(index   , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    }
    // Explicit MOCS Table
    //              Index     ESC	  SCC	  L3CC    LeCC    TC      LRUM    DAoM	  ERSC	  SCC	  PFM	  SCF     CoS     SSE
    GMM_DEFINE_MOCS( 1      , 0     , 0     , 3     , 0     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 2      , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 3      , 0     , 0     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 4      , 0     , 0     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 5      , 0     , 0     , 1     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 6      , 0     , 0     , 1     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 7      , 0     , 0     , 3     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 8      , 0     , 0     , 1     , 3     , 1     , 2     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 9      , 0     , 0     , 3     , 3     , 1     , 2     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 10     , 0     , 0     , 1     , 3     , 1     , 3     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 11     , 0     , 0     , 3     , 3     , 1     , 3     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 12     , 0     , 0     , 1     , 3     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 13     , 0     , 0     , 3     , 3     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 14     , 0     , 0     , 1     , 3     , 1     , 2     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 15     , 0     , 0     , 3     , 3     , 1     , 2     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 16     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 17     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 18     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 3 )
    GMM_DEFINE_MOCS( 19     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 7     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 20     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 3     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 21     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 1     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 22     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 1     , 3     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 23     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 1     , 7     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 62     , 0     , 0     , 1     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 63     , 0     , 0     , 1     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )

    if(pGmmLibContext->GetSkuTable().FtrLLCBypass)
    {
        GMM_DEFINE_MOCS( 16     , 0     , 0     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 1     , 0     , 0 )
        GMM_DEFINE_MOCS( 17     , 0     , 0     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 1     , 0     , 0 )
    }

    CurrentMaxMocsIndex         = 23;

// clang-format on
#undef GMM_DEFINE_MOCS
}